

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall
cmFindLibraryHelper::RegexFromList
          (cmFindLibraryHelper *this,string *out,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in)

{
  cmFindLibraryHelper *this_00;
  pointer in_00;
  
  std::__cxx11::string::append((char *)out);
  for (in_00 = (in->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      in_00 != (in->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish; in_00 = in_00 + 1) {
    this_00 = (cmFindLibraryHelper *)out;
    std::__cxx11::string::append((char *)out);
    RegexFromLiteral(this_00,out,in_00);
  }
  std::__cxx11::string::append((char *)out);
  return;
}

Assistant:

void cmFindLibraryHelper::RegexFromList(std::string& out,
                                        std::vector<std::string> const& in)
{
  // Surround the list in parens so the '|' does not apply to anything
  // else and the result can be checked after matching.
  out += "(";
  const char* sep = "";
  for (std::vector<std::string>::const_iterator si = in.begin();
       si != in.end(); ++si) {
    // Separate from previous item.
    out += sep;
    sep = "|";

    // Append this item.
    this->RegexFromLiteral(out, *si);
  }
  out += ")";
}